

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instdb.cpp
# Opt level: O1

InstId asmjit::v1_14::InstNameUtils::find
                 (char *s,size_t len,InstNameIndex *nameIndex,uint32_t *nameTable,char *stringTable)

{
  ulong uVar1;
  uint uVar2;
  uint32_t *puVar3;
  void *pvVar4;
  ulong uVar5;
  char cVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  InstId local_74;
  char nameData [32];
  
  if (s != (char *)0x0) {
    if (len == 0xffffffffffffffff) {
      len = strlen(s);
    }
    if ((len - 1 < (ulong)nameIndex->maxNameLength) && (uVar2 = (int)*s - 0x61, uVar2 < 0x1a)) {
      uVar12 = (ulong)nameIndex->data[uVar2].start;
      if ((uVar12 != 0) && (uVar10 = nameIndex->data[uVar2].end - uVar12, uVar10 != 0)) {
        do {
          lVar11 = (uVar10 >> 1) + uVar12;
          uVar2 = nameTable[lVar11];
          if ((int)uVar2 < 0) {
            uVar8 = 0;
            do {
              uVar7 = uVar2 & 0x1f;
              if (uVar7 == 0) goto LAB_0010fb8b;
              cVar6 = (char)uVar7 + '`';
              if (0x1a < uVar7) {
                cVar6 = (char)uVar7 + '\x15';
              }
              nameData[uVar8] = cVar6;
              uVar8 = uVar8 + 1;
              uVar2 = uVar2 >> 5;
            } while (uVar8 != 6);
            uVar8 = 6;
          }
          else {
            uVar7 = uVar2 >> 0xc & 0xf;
            uVar8 = (ulong)uVar7;
            puVar3 = nameTable;
            if (uVar7 != 0) {
              puVar3 = (uint32_t *)memcpy(nameData,stringTable + (uVar2 & 0xfff),uVar8);
            }
            uVar7 = (uint)puVar3;
            if (0xfffffff < uVar2) {
              pvVar4 = memcpy(nameData + uVar8,stringTable + (uVar2 >> 0x10 & 0xfff),
                              (ulong)(uVar2 >> 0x1c));
              uVar7 = (uint)pvVar4;
            }
            uVar8 = uVar8 + (uVar2 >> 0x1c);
          }
LAB_0010fb8b:
          uVar5 = len;
          if (uVar8 < len) {
            uVar5 = uVar8;
          }
          bVar13 = uVar5 != 0;
          if ((bVar13) && (uVar7 = (uint)(byte)*s - (uint)(byte)nameData[0], *s == nameData[0])) {
            uVar1 = 1;
            do {
              uVar9 = uVar1;
              uVar2 = uVar7;
              if (uVar5 == uVar9) break;
              uVar1 = uVar9 + 1;
              uVar2 = (uint)(byte)s[uVar9] - (uint)(byte)nameData[uVar9];
            } while (s[uVar9] == nameData[uVar9]);
            uVar7 = uVar2;
            bVar13 = uVar9 < uVar5;
          }
          uVar2 = (int)len - (int)uVar8;
          if (bVar13) {
            uVar2 = uVar7;
          }
          bVar13 = true;
          uVar8 = uVar10;
          if (-1 < (int)uVar2) {
            if (uVar2 == 0) {
              bVar13 = false;
              local_74 = (InstId)lVar11;
            }
            else {
              uVar12 = lVar11 + 1;
              uVar8 = uVar10 - 1;
            }
          }
          if (!bVar13) {
            return local_74;
          }
          uVar10 = uVar8 >> 1;
        } while (1 < uVar8);
      }
    }
  }
  return 0;
}

Assistant:

InstId find(const char* s, size_t len, const InstNameIndex& nameIndex, const uint32_t* nameTable, const char* stringTable) noexcept {
  if (ASMJIT_UNLIKELY(!s))
    return BaseInst::kIdNone;

  if (len == SIZE_MAX)
    len = strlen(s);

  if (ASMJIT_UNLIKELY(len == 0 || len > nameIndex.maxNameLength))
    return BaseInst::kIdNone;

  uint32_t prefix = uint32_t(s[0]) - 'a';
  if (ASMJIT_UNLIKELY(prefix > 'z' - 'a'))
    return BaseInst::kIdNone;

  size_t base = nameIndex.data[prefix].start;
  size_t end = nameIndex.data[prefix].end;

  if (ASMJIT_UNLIKELY(!base))
    return BaseInst::kIdNone;

  char nameData[kBufferSize];
  for (size_t lim = end - base; lim != 0; lim >>= 1) {
    size_t instId = base + (lim >> 1);
    size_t nameSize = decodeToBuffer(nameData, nameTable[instId], stringTable);

    int result = Support::compareStringViews(s, len, nameData, nameSize);
    if (result < 0)
      continue;

    if (result > 0) {
      base = instId + 1;
      lim--;
      continue;
    }

    return InstId(instId);
  }

  return BaseInst::kIdNone;
}